

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall dxil_spv::CFGNode::post_dominates_perfect_structured_construct(CFGNode *this)

{
  CFGNode *pCVar1;
  CFGNode *pCVar2;
  pointer ppCVar3;
  bool bVar4;
  
  pCVar2 = this->immediate_dominator;
  while (pCVar2 != this) {
    pCVar1 = pCVar2->immediate_post_dominator;
    if ((pCVar1 == (CFGNode *)0x0) || (bVar4 = pCVar2 == pCVar1, pCVar2 = pCVar1, bVar4)) {
      return false;
    }
  }
  ppCVar3 = (this->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar3 ==
        (this->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    pCVar2 = *ppCVar3;
    while (pCVar2 != this) {
      pCVar1 = pCVar2->immediate_post_dominator;
      if (pCVar1 == (CFGNode *)0x0) {
        return false;
      }
      bVar4 = pCVar2 == pCVar1;
      pCVar2 = pCVar1;
      if (bVar4) {
        return false;
      }
    }
    ppCVar3 = ppCVar3 + 1;
  } while( true );
}

Assistant:

bool CFGNode::post_dominates_perfect_structured_construct() const
{
	if (!post_dominates(immediate_dominator))
		return false;

	for (auto *p : pred)
		if (!post_dominates(p))
			return false;
	return true;
}